

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

void Min_CoverExpand(Min_Man_t *p,Min_Cube_t *pCover)

{
  Min_Cube_t *local_38;
  Min_Cube_t *local_30;
  Min_Cube_t *local_28;
  Min_Cube_t *pCube2;
  Min_Cube_t *pCube;
  Min_Cube_t *pCover_local;
  Min_Man_t *p_local;
  
  Min_ManClean(p,p->nVars);
  if (pCover == (Min_Cube_t *)0x0) {
    local_30 = (Min_Cube_t *)0x0;
  }
  else {
    local_30 = pCover->pNext;
  }
  local_28 = local_30;
  pCube2 = pCover;
  while (pCube2 != (Min_Cube_t *)0x0) {
    pCube2->pNext = p->ppStore[*(uint *)&pCube2->field_0x8 >> 0x16];
    p->ppStore[*(uint *)&pCube2->field_0x8 >> 0x16] = pCube2;
    p->nCubes = p->nCubes + 1;
    pCube2 = local_28;
    if (local_28 == (Min_Cube_t *)0x0) {
      local_38 = (Min_Cube_t *)0x0;
    }
    else {
      local_38 = local_28->pNext;
    }
    local_28 = local_38;
  }
  return;
}

Assistant:

void Min_CoverExpand( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube, * pCube2;
    Min_ManClean( p, p->nVars );
    Min_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        pCube->pNext = p->ppStore[pCube->nLits];
        p->ppStore[pCube->nLits] = pCube;
        p->nCubes++;
    }
}